

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

Move<vk::VkCommandBuffer_s_*> * __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::recordQueryPoolReset
          (Move<vk::VkCommandBuffer_s_*> *__return_storage_ptr__,OcclusionQueryTestInstance *this,
          VkCommandPool cmdPool)

{
  VkDevice device_00;
  DeviceInterface *vk_00;
  VkCommandBuffer_s **ppVVar1;
  undefined1 local_60 [8];
  CmdBufferBeginInfo beginInfo;
  DeviceInterface *vk;
  VkDevice device;
  OcclusionQueryTestInstance *this_local;
  VkCommandPool cmdPool_local;
  Move<vk::VkCommandBuffer_s_*> *cmdBuffer;
  
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  beginInfo.super_VkCommandBufferBeginInfo.pInheritanceInfo =
       (VkCommandBufferInheritanceInfo *)cmdPool.m_internal;
  ::vk::allocateCommandBuffer
            (__return_storage_ptr__,vk_00,device_00,cmdPool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  Draw::CmdBufferBeginInfo::CmdBufferBeginInfo((CmdBufferBeginInfo *)local_60,0);
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&__return_storage_ptr__->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar1,local_60);
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&__return_storage_ptr__->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x70])(vk_00,*ppVVar1,(this->m_queryPool).m_internal,0,3);
  ppVVar1 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&__return_storage_ptr__->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar1);
  return __return_storage_ptr__;
}

Assistant:

vk::Move<vk::VkCommandBuffer> OcclusionQueryTestInstance::recordQueryPoolReset (vk::VkCommandPool cmdPool)
{
	const vk::VkDevice				device		= m_context.getDevice();
	const vk::DeviceInterface&		vk			= m_context.getDeviceInterface();

	DE_ASSERT(hasSeparateResetCmdBuf());

	vk::Move<vk::VkCommandBuffer>	cmdBuffer	(vk::allocateCommandBuffer(vk, device, cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	CmdBufferBeginInfo				beginInfo	(0u);

	vk.beginCommandBuffer(*cmdBuffer, &beginInfo);
	vk.cmdResetQueryPool(*cmdBuffer, m_queryPool, 0, NUM_QUERIES_IN_POOL);
	vk.endCommandBuffer(*cmdBuffer);

	return cmdBuffer;
}